

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_func_call_arg_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg,uint32_t id)

{
  MSLFormatResolution MVar1;
  SPIRFunction *pSVar2;
  bool bVar3;
  bool bVar4;
  SPIRType *expr_type;
  SPIRType *pSVar5;
  SPIRConstant *pSVar6;
  TypedID<(spirv_cross::Types)0> *pTVar7;
  SPIRVariable *pSVar8;
  MSLConstexprSampler *pMVar9;
  size_type sVar10;
  CompilerError *this_00;
  VariableID VVar11;
  uint32_t uVar12;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *pSVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  uint *in_R9;
  VariableID id_00;
  byte bVar14;
  uint32_t id_local;
  undefined2 uStack_1f4;
  byte local_1f2;
  byte local_1f1;
  string *local_1f0;
  undefined1 local_1e8 [44];
  uint32_t local_1bc;
  undefined1 local_1b8 [40];
  SPIRType *local_190;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  samp_args;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  id_local = id;
  local_1f0 = __return_storage_ptr__;
  expr_type = Compiler::expression_type((Compiler *)this,id);
  local_1f1 = Compiler::has_extended_decoration
                        ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler);
  local_1b8._32_8_ = arg;
  bVar3 = Compiler::has_extended_decoration
                    ((Compiler *)this,id_local,SPIRVCrossDecorationDynamicImageSampler);
  bVar14 = local_1f1 ^ 1;
  if (!bVar3 && bVar14 == 0) {
    pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(expr_type->image).type.id);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
    (**(code **)((long)&in_R8[4].field_2 + 8))(local_1e8,this,pSVar5,0);
    join<char_const(&)[24],std::__cxx11::string,char_const(&)[3]>
              ((string *)&samp_args,(spirv_cross *)"spvDynamicImageSampler<",
               (char (*) [24])local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2974b3,
               (char (*) [3])in_R8);
    ::std::__cxx11::string::operator=((string *)local_1f0,(string *)&samp_args);
    ::std::__cxx11::string::~string((string *)&samp_args);
    ::std::__cxx11::string::~string((string *)local_1e8);
  }
  pSVar6 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,id_local);
  if (((pSVar6 == (SPIRConstant *)0x0) || ((this->msl_options).force_native_arrays == false)) ||
     (pSVar5 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(pSVar6->super_IVariant).field_0xc),
     (pSVar5->array).super_VectorView<unsigned_int>.buffer_size == 0)) {
    bVar4 = CompilerGLSL::should_dereference_caller_param(&this->super_CompilerGLSL,id_local);
    if (bVar4) {
      CompilerGLSL::to_func_call_arg_abi_cxx11_
                ((string *)local_1e8,&this->super_CompilerGLSL,(Parameter *)local_1b8._32_8_,
                 id_local);
      CompilerGLSL::dereference_expression
                ((string *)&samp_args,&this->super_CompilerGLSL,expr_type,(string *)local_1e8);
      ::std::__cxx11::string::append((string *)local_1f0);
      ::std::__cxx11::string::~string((string *)&samp_args);
      pSVar13 = (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)local_1e8;
    }
    else {
      CompilerGLSL::to_func_call_arg_abi_cxx11_
                ((string *)&samp_args,&this->super_CompilerGLSL,(Parameter *)local_1b8._32_8_,
                 id_local);
      ::std::__cxx11::string::append((string *)local_1f0);
      pSVar13 = &samp_args;
    }
    ::std::__cxx11::string::~string((string *)pSVar13);
  }
  else {
    join<char_const(&)[2],unsigned_int&,char_const(&)[12]>
              ((string *)&samp_args,(spirv_cross *)0x282e15,(char (*) [2])&id_local,
               (uint *)"_array_copy",(char (*) [12])in_R8);
    ::std::__cxx11::string::operator=((string *)local_1f0,(string *)&samp_args);
    ::std::__cxx11::string::~string((string *)&samp_args);
    pSVar2 = (this->super_CompilerGLSL).super_Compiler.current_function;
    pTVar7 = (pSVar2->constant_arrays_needed_on_stack).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    samp_args.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(samp_args.
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .ptr._4_4_,id_local);
    pTVar7 = ::std::
             __find_if<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)0>const>>
                       (pTVar7,pTVar7 + (pSVar2->constant_arrays_needed_on_stack).
                                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
                                        .buffer_size,&samp_args);
    if (pTVar7 == (pSVar2->constant_arrays_needed_on_stack).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr +
                  (pSVar2->constant_arrays_needed_on_stack).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size) {
      Compiler::force_recompile((Compiler *)this);
      samp_args.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(samp_args.
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .ptr._4_4_,id_local);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back
                (&pSVar2->constant_arrays_needed_on_stack,
                 (TypedID<(spirv_cross::Types)0> *)&samp_args);
    }
  }
  pSVar8 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,id_local);
  if (pSVar8 == (SPIRVariable *)0x0) {
    local_1bc = 0;
  }
  else {
    local_1bc = (pSVar8->basevariable).id;
  }
  id_00.id = local_1bc;
  if (bVar3) goto LAB_001f0373;
  uVar12 = local_1bc;
  if (local_1bc == 0) {
    uVar12 = id_local;
  }
  pMVar9 = find_constexpr_sampler(this,uVar12);
  if (expr_type->basetype == SampledImage) {
    uVar12 = 1;
    local_190 = expr_type;
    if (((pMVar9 != (MSLConstexprSampler *)0x0) && (pMVar9->ycbcr_conversion_enable == true)) &&
       (uVar12 = pMVar9->planes, *(bool *)(local_1b8._32_8_ + 0x10) == false)) {
      add_spv_func_and_recompile(this,SPVFuncImplDynamicImageSampler);
    }
    local_1f2 = bVar14;
    local_1e8._32_8_ = pMVar9;
    for (local_1b8._0_4_ = 1; expr_type = local_190, id_00.id = local_1bc,
        pMVar9 = (MSLConstexprSampler *)local_1e8._32_8_, bVar14 = local_1f2,
        (uint)local_1b8._0_4_ < uVar12; local_1b8._0_4_ = local_1b8._0_4_ + 1) {
      CompilerGLSL::to_func_call_arg_abi_cxx11_
                ((string *)local_1e8,&this->super_CompilerGLSL,(Parameter *)local_1b8._32_8_,
                 id_local);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
      join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                ((string *)&samp_args,(spirv_cross *)0x294843,(char (*) [3])local_1e8,
                 &this->plane_name_suffix,in_R8,in_R9);
      ::std::__cxx11::string::append((string *)local_1f0);
      ::std::__cxx11::string::~string((string *)&samp_args);
      ::std::__cxx11::string::~string((string *)local_1e8);
    }
    if ((local_190->image).dim != DimBuffer) {
      uVar12 = local_1bc;
      if (local_1bc == 0) {
        uVar12 = id_local;
      }
      to_sampler_expression_abi_cxx11_((string *)local_1e8,this,uVar12);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &samp_args,", ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e8);
      ::std::__cxx11::string::append((string *)local_1f0);
      ::std::__cxx11::string::~string((string *)&samp_args);
      ::std::__cxx11::string::~string((string *)local_1e8);
    }
    if ((pMVar9 == (MSLConstexprSampler *)0x0 || bVar14 != 0) ||
       (*(bool *)((long)pMVar9 + 99) != true)) goto LAB_001f01af;
    samp_args.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &samp_args.stack_storage;
    samp_args.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .buffer_size = 0;
    samp_args.buffer_capacity = 8;
    MVar1 = *(MSLFormatResolution *)((long)pMVar9 + 0x34);
    if (MVar1 != MSL_FORMAT_RESOLUTION_444) {
      if (MVar1 == MSL_FORMAT_RESOLUTION_420) {
        ::std::__cxx11::string::string
                  ((string *)local_1e8,"spvFormatResolution::_420",(allocator *)local_1b8);
      }
      else {
        if (MVar1 != MSL_FORMAT_RESOLUTION_422) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(this_00,"Invalid format resolution.");
          goto LAB_001f045b;
        }
        ::std::__cxx11::string::string
                  ((string *)local_1e8,"spvFormatResolution::_422",(allocator *)local_1b8);
      }
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&samp_args,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
      ::std::__cxx11::string::~string((string *)local_1e8);
      pMVar9 = (MSLConstexprSampler *)local_1e8._32_8_;
    }
    if (pMVar9->chroma_filter != MSL_SAMPLER_FILTER_NEAREST) {
      ::std::__cxx11::string::string
                ((string *)local_1e8,"spvChromaFilter::linear",(allocator *)local_1b8);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&samp_args,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
      ::std::__cxx11::string::~string((string *)local_1e8);
      pMVar9 = (MSLConstexprSampler *)local_1e8._32_8_;
    }
    if (pMVar9->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
      ::std::__cxx11::string::string
                ((string *)local_1e8,"spvXChromaLocation::midpoint",(allocator *)local_1b8);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&samp_args,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
      ::std::__cxx11::string::~string((string *)local_1e8);
      pMVar9 = (MSLConstexprSampler *)local_1e8._32_8_;
    }
    if (pMVar9->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
      ::std::__cxx11::string::string
                ((string *)local_1e8,"spvYChromaLocation::midpoint",(allocator *)local_1b8);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&samp_args,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
      ::std::__cxx11::string::~string((string *)local_1e8);
      pMVar9 = (MSLConstexprSampler *)local_1e8._32_8_;
    }
    switch(pMVar9->ycbcr_model) {
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
      goto switchD_001f0054_caseD_0;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
      ::std::__cxx11::string::string
                ((string *)local_1e8,"spvYCbCrModelConversion::ycbcr_identity",
                 (allocator *)local_1b8);
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
      ::std::__cxx11::string::string
                ((string *)local_1e8,"spvYCbCrModelConversion::ycbcr_bt_709",(allocator *)local_1b8)
      ;
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
      ::std::__cxx11::string::string
                ((string *)local_1e8,"spvYCbCrModelConversion::ycbcr_bt_601",(allocator *)local_1b8)
      ;
      break;
    case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
      ::std::__cxx11::string::string
                ((string *)local_1e8,"spvYCbCrModelConversion::ycbcr_bt_2020",(allocator *)local_1b8
                );
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid Y\'CbCr model conversion.");
LAB_001f045b:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&samp_args,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    ::std::__cxx11::string::~string((string *)local_1e8);
    pMVar9 = (MSLConstexprSampler *)local_1e8._32_8_;
switchD_001f0054_caseD_0:
    if (pMVar9->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL) {
      ::std::__cxx11::string::string
                ((string *)local_1e8,"spvYCbCrRange::itu_narrow",(allocator *)local_1b8);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&samp_args,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
      ::std::__cxx11::string::~string((string *)local_1e8);
      pMVar9 = (MSLConstexprSampler *)local_1e8._32_8_;
    }
    join<char_const(&)[18],unsigned_int_const&,char_const(&)[2]>
              ((string *)local_1e8,(spirv_cross *)"spvComponentBits(",(char (*) [18])&pMVar9->bpc,
               (uint *)0x27e75d,(char (*) [2])in_R8);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&samp_args,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    ::std::__cxx11::string::~string((string *)local_1e8);
    merge((string *)local_1b8,&samp_args,", ");
    join<char_const(&)[19],std::__cxx11::string,char_const(&)[2]>
              ((string *)local_1e8,(spirv_cross *)", spvYCbCrSampler(",(char (*) [19])local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,
               (char (*) [2])in_R8);
    bVar14 = local_1f2;
    ::std::__cxx11::string::append((string *)local_1f0);
    pMVar9 = (MSLConstexprSampler *)local_1e8._32_8_;
    ::std::__cxx11::string::~string((string *)local_1e8);
    ::std::__cxx11::string::~string((string *)local_1b8);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::~SmallVector(&samp_args);
  }
LAB_001f01af:
  if ((bVar14 == 0 && pMVar9 != (MSLConstexprSampler *)0x0) &&
     (pMVar9->ycbcr_conversion_enable == true)) {
    create_swizzle_abi_cxx11_((string *)local_1e8,pMVar9->swizzle[3]);
    create_swizzle_abi_cxx11_((string *)local_1b8,pMVar9->swizzle[2]);
    create_swizzle_abi_cxx11_(&local_50,pMVar9->swizzle[1]);
    create_swizzle_abi_cxx11_(&local_70,pMVar9->swizzle[0]);
    join<char_const(&)[9],std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[16],std::__cxx11::string,char_const(&)[2]>
              ((string *)&samp_args,(spirv_cross *)", (uint(",(char (*) [9])local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ") << 24) | (uint(",(char (*) [18])local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ") << 16) | (uint(",(char (*) [18])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ") << 8) | uint(",(char (*) [16])&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,
               (char (*) [2])CONCAT17(local_1f1,CONCAT16(local_1f2,CONCAT24(uStack_1f4,id_local))));
    ::std::__cxx11::string::append((string *)local_1f0);
    ::std::__cxx11::string::~string((string *)&samp_args);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
    pSVar13 = (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)local_1b8;
LAB_001f02ec:
    ::std::__cxx11::string::~string((string *)pSVar13);
    ::std::__cxx11::string::~string((string *)local_1e8);
  }
  else if (((this->msl_options).swizzle_texture_samples == true) &&
          ((this->has_sampled_images == true &&
           (bVar3 = Compiler::is_sampled_image_type((Compiler *)this,expr_type), bVar3)))) {
    VVar11.id = id_00.id;
    if (id_00.id == 0) {
      VVar11.id = id_local;
    }
    to_swizzle_expression_abi_cxx11_((string *)local_1e8,this,VVar11.id);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samp_args
                     ,", ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e8);
    ::std::__cxx11::string::append((string *)local_1f0);
    pSVar13 = &samp_args;
    goto LAB_001f02ec;
  }
  bVar3 = buffer_requires_array_length(this,id_00);
  if (bVar3) {
    VVar11.id = id_00.id;
    if (id_00.id == 0) {
      VVar11.id = id_local;
    }
    to_buffer_size_expression_abi_cxx11_((string *)local_1e8,this,VVar11.id);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&samp_args
                     ,", ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e8);
    ::std::__cxx11::string::append((string *)local_1f0);
    ::std::__cxx11::string::~string((string *)&samp_args);
    ::std::__cxx11::string::~string((string *)local_1e8);
  }
  if (local_1f1 != 0) {
    ::std::__cxx11::string::append((char *)local_1f0);
  }
LAB_001f0373:
  pSVar8 = Compiler::maybe_get_backing_variable((Compiler *)this,id_00.id);
  if (pSVar8 != (SPIRVariable *)0x0) {
    samp_args.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(samp_args.
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .ptr._4_4_,(pSVar8->super_IVariant).self.id);
    sVar10 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->atomic_image_vars_emulated)._M_h,(key_type *)&samp_args);
    if (sVar10 != 0) {
      CompilerGLSL::to_expression_abi_cxx11_
                ((string *)local_1b8,&this->super_CompilerGLSL,id_00.id,true);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e8,", ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &samp_args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e8,"_atomic");
      ::std::__cxx11::string::append((string *)local_1f0);
      ::std::__cxx11::string::~string((string *)&samp_args);
      ::std::__cxx11::string::~string((string *)local_1e8);
      ::std::__cxx11::string::~string((string *)local_1b8);
    }
  }
  return local_1f0;
}

Assistant:

string CompilerMSL::to_func_call_arg(const SPIRFunction::Parameter &arg, uint32_t id)
{
	string arg_str;

	auto &type = expression_type(id);
	bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	// If the argument *itself* is a "dynamic" combined-image sampler, then we can just pass that around.
	bool arg_is_dynamic_img_sampler = has_extended_decoration(id, SPIRVCrossDecorationDynamicImageSampler);
	if (is_dynamic_img_sampler && !arg_is_dynamic_img_sampler)
		arg_str = join("spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">(");

	auto *c = maybe_get<SPIRConstant>(id);
	if (msl_options.force_native_arrays && c && !get<SPIRType>(c->constant_type).array.empty())
	{
		// If we are passing a constant array directly to a function for some reason,
		// the callee will expect an argument in thread const address space
		// (since we can only bind to arrays with references in MSL).
		// To resolve this, we must emit a copy in this address space.
		// This kind of code gen should be rare enough that performance is not a real concern.
		// Inline the SPIR-V to avoid this kind of suboptimal codegen.
		//
		// We risk calling this inside a continue block (invalid code),
		// so just create a thread local copy in the current function.
		arg_str = join("_", id, "_array_copy");
		auto &constants = current_function->constant_arrays_needed_on_stack;
		auto itr = find(begin(constants), end(constants), ID(id));
		if (itr == end(constants))
		{
			force_recompile();
			constants.push_back(id);
		}
	}
	// Dereference pointer variables where needed.
	// FIXME: This dereference is actually backwards. We should really just support passing pointer variables between functions.
	else if (should_dereference_caller_param(id))
		arg_str += dereference_expression(type, CompilerGLSL::to_func_call_arg(arg, id));
	else
		arg_str += CompilerGLSL::to_func_call_arg(arg, id);

	// Need to check the base variable in case we need to apply a qualified alias.
	uint32_t var_id = 0;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var)
		var_id = var->basevariable;

	if (!arg_is_dynamic_img_sampler)
	{
		auto *constexpr_sampler = find_constexpr_sampler(var_id ? var_id : id);
		if (type.basetype == SPIRType::SampledImage)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			{
				planes = constexpr_sampler->planes;
				// If this parameter isn't aliasing a global, then we need to use
				// the special "dynamic image-sampler" class to pass it--and we need
				// to use it for *every* non-alias parameter, in case a combined
				// image-sampler with a Y'CbCr conversion is passed. Hopefully, this
				// pathological case is so rare that it should never be hit in practice.
				if (!arg.alias_global_variable)
					add_spv_func_and_recompile(SPVFuncImplDynamicImageSampler);
			}
			for (uint32_t i = 1; i < planes; i++)
				arg_str += join(", ", CompilerGLSL::to_func_call_arg(arg, id), plane_name_suffix, i);
			// Manufacture automatic sampler arg if the arg is a SampledImage texture.
			if (type.image.dim != DimBuffer)
				arg_str += ", " + to_sampler_expression(var_id ? var_id : id);

			// Add sampler Y'CbCr conversion info if we have it
			if (is_dynamic_img_sampler && constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			{
				SmallVector<string> samp_args;

				switch (constexpr_sampler->resolution)
				{
				case MSL_FORMAT_RESOLUTION_444:
					// Default
					break;
				case MSL_FORMAT_RESOLUTION_422:
					samp_args.push_back("spvFormatResolution::_422");
					break;
				case MSL_FORMAT_RESOLUTION_420:
					samp_args.push_back("spvFormatResolution::_420");
					break;
				default:
					SPIRV_CROSS_THROW("Invalid format resolution.");
				}

				if (constexpr_sampler->chroma_filter != MSL_SAMPLER_FILTER_NEAREST)
					samp_args.push_back("spvChromaFilter::linear");

				if (constexpr_sampler->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN)
					samp_args.push_back("spvXChromaLocation::midpoint");
				if (constexpr_sampler->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN)
					samp_args.push_back("spvYChromaLocation::midpoint");
				switch (constexpr_sampler->ycbcr_model)
				{
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
					// Default
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_identity");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_709");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_601");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_2020");
					break;
				default:
					SPIRV_CROSS_THROW("Invalid Y'CbCr model conversion.");
				}
				if (constexpr_sampler->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL)
					samp_args.push_back("spvYCbCrRange::itu_narrow");
				samp_args.push_back(join("spvComponentBits(", constexpr_sampler->bpc, ")"));
				arg_str += join(", spvYCbCrSampler(", merge(samp_args), ")");
			}
		}

		if (is_dynamic_img_sampler && constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			arg_str += join(", (uint(", create_swizzle(constexpr_sampler->swizzle[3]), ") << 24) | (uint(",
			                create_swizzle(constexpr_sampler->swizzle[2]), ") << 16) | (uint(",
			                create_swizzle(constexpr_sampler->swizzle[1]), ") << 8) | uint(",
			                create_swizzle(constexpr_sampler->swizzle[0]), ")");
		else if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(type))
			arg_str += ", " + to_swizzle_expression(var_id ? var_id : id);

		if (buffer_requires_array_length(var_id))
			arg_str += ", " + to_buffer_size_expression(var_id ? var_id : id);

		if (is_dynamic_img_sampler)
			arg_str += ")";
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(var_id);
	if (backing_var && atomic_image_vars_emulated.count(backing_var->self))
	{
		arg_str += ", " + to_expression(var_id) + "_atomic";
	}

	return arg_str;
}